

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O0

int __thiscall
sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
::remove(LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
         *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  value_type *pvVar3;
  CacheNode *extraout_RAX;
  CacheNode *pCVar4;
  CacheNode *node;
  iterator it;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  *in_stack_ffffffffffffffc8;
  CacheNode *in_stack_ffffffffffffffd0;
  Node *in_stack_ffffffffffffffd8;
  iterator local_20;
  char *local_10;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *local_8;
  int iVar2;
  
  local_10 = __filename;
  local_8 = this;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  ::find((map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
          *)in_stack_ffffffffffffffd8,(long *)in_stack_ffffffffffffffd0);
  map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
  ::end(in_stack_ffffffffffffffc8);
  bVar1 = map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
          ::iterator::operator!=(&local_20,(iterator *)&stack0xffffffffffffffd0);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    pvVar3 = map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
             ::iterator::operator->(&local_20);
    pCVar4 = pvVar3->second;
    if (pCVar4->prec == (CacheNode *)0x0) {
      this->head = pCVar4->succ;
    }
    else {
      pCVar4->prec->succ = pCVar4->succ;
    }
    if (pCVar4->succ == (CacheNode *)0x0) {
      this->tail = pCVar4->prec;
    }
    else {
      pCVar4->succ->prec = pCVar4->prec;
    }
    if (pCVar4 != (CacheNode *)0x0) {
      CacheNode::~CacheNode(in_stack_ffffffffffffffd0);
      operator_delete(pCVar4,0x670);
      pCVar4 = extraout_RAX;
    }
    iVar2 = (int)pCVar4;
  }
  return iVar2;
}

Assistant:

void remove(const locType &offset)
		{
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			if (it != table.end())
			{
				CacheNode *node = it -> second;
				if (node -> prec) node -> prec -> succ = node -> succ;
				else head = node -> succ;
				if (node -> succ) node -> succ -> prec = node -> prec;
				else tail = node -> prec;
				delete node;
			}
		}